

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall cli::Parser::Parser(Parser *this,int argc,char **argv)

{
  char *pcVar1;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int i;
  allocator local_21;
  char **local_20;
  char **argv_local;
  Parser *pPStack_10;
  int argc_local;
  Parser *this_local;
  
  pcVar1 = *argv;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pPStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_arguments);
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::vector
            (&this->_commands);
  for (local_38 = 1; local_38 < argv_local._4_4_; local_38 = local_38 + 1) {
    pcVar1 = local_20[local_38];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,&local_59);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_arguments,(value_type *)local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  enable_help(this);
  return;
}

Assistant:

explicit Parser(int argc, char** argv) : 
			_appname(argv[0]) {
			for (int i = 1; i < argc; ++i) {
				_arguments.push_back(argv[i]);
			}
			enable_help();
		}